

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

void __thiscall wtlgo::bf::ASTBody::compute(ASTBody *this,VM *vm)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->body).
                super__List_base<std::shared_ptr<const_wtlgo::bf::AST>,_std::allocator<std::shared_ptr<const_wtlgo::bf::AST>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->body; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))(p_Var1[1]._M_next,vm);
  }
  return;
}

Assistant:

void ASTBody::compute(VM& vm) const {
    for(const auto& term : body)
        term->compute(vm);
}